

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<64u,unsigned_short,void,true>::wr_string<char*>
          (uintwide_t<64u,unsigned_short,void,true> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  short *psVar1;
  value_type_conflict3 avVar2 [4];
  short sVar3;
  ushort uVar4;
  unsigned_fast_type i_1;
  long lVar5;
  uintwide_t<64U,_unsigned_short,_void,_true> uVar6;
  unsigned_fast_type uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  undefined7 in_register_00000011;
  value_type_conflict3 avVar15 [4];
  bool bVar16;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  array<unsigned_short,_4UL> local_78;
  value_type_conflict3 local_70 [4];
  byte abStack_68 [23];
  uint uStack_51;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 local_4b;
  value_type_conflict3 local_40 [4];
  value_type_conflict3 local_38 [4];
  
  iVar12 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar12 == 0x10) {
    local_78.elems = *(value_type_conflict3 (*) [4])this;
    abStack_68[0] = 0;
    abStack_68[1] = 0;
    abStack_68[2] = 0;
    abStack_68[3] = 0;
    abStack_68[4] = 0;
    abStack_68[5] = 0;
    abStack_68[6] = 0;
    abStack_68[7] = 0;
    abStack_68[8] = 0;
    abStack_68[9] = 0;
    abStack_68[10] = 0;
    abStack_68[0xb] = 0;
    abStack_68[0xc] = 0;
    abStack_68[0xd] = 0;
    abStack_68[0xe] = 0;
    abStack_68[0xf] = 0;
    abStack_68[0x10] = 0;
    abStack_68[0x11] = 0;
    abStack_68[0x12] = 0;
    abStack_68[0x13] = 0;
    abStack_68[0x14] = 0;
    abStack_68[0x15] = 0;
    abStack_68[0x16] = 0;
    uStack_51 = uStack_51 & 0xffffff00;
    lVar5 = 0;
    do {
      sVar3 = *(short *)((long)local_78.elems + lVar5);
      if (sVar3 != 0) break;
      bVar16 = lVar5 != 6;
      lVar5 = lVar5 + 2;
    } while (bVar16);
    if (sVar3 == 0) {
      abStack_68[0x16] = 0x30;
      uVar8 = 0x16;
    }
    else {
      uVar7 = uintwide_t<64U,_unsigned_short,_void,_true>::extract_hex_digits<false,_nullptr>
                        ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_78,(char *)&uStack_51
                         ,is_uppercase);
      uVar8 = 0x17 - uVar7;
    }
    if ((show_base) && (1 < (long)uVar8)) {
      abStack_68[(int)uVar8 - 1] = !is_uppercase << 5 | 0x58;
      uVar8 = uVar8 - 2;
      abStack_68[uVar8 & 0xffffffff] = 0x30;
    }
    if ((show_pos) && (0 < (long)uVar8)) {
      uVar8 = uVar8 - 1;
      abStack_68[uVar8 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar5 = 0;
      if (field_width < 0x18) {
        lVar5 = 0x17 - field_width;
      }
      while (lVar5 < (long)uVar8) {
        uVar8 = uVar8 - 1;
        abStack_68[uVar8 & 0xffffffff] = fill_char_str;
      }
    }
    uStack_51 = uStack_51 & 0xffffff00;
    lVar5 = 0;
    do {
      bVar10 = abStack_68[lVar5 + uVar8];
      str_result[lVar5] = bVar10;
      lVar5 = lVar5 + 1;
    } while (bVar10 != 0);
    return true;
  }
  if (iVar12 != 10) {
    if (iVar12 != 8) {
      return false;
    }
    avVar15 = *(value_type_conflict3 (*) [4])this;
    local_78.elems[0] = avVar15[0];
    local_78.elems[1] = avVar15[1];
    local_78.elems[2] = avVar15[2];
    local_78.elems[3] = avVar15[3];
    abStack_68[0x10] = 0;
    abStack_68[0x11] = 0;
    abStack_68[0x12] = 0;
    abStack_68[0x13] = 0;
    abStack_68[0x14] = 0;
    abStack_68[0x15] = 0;
    abStack_68[0x16] = 0;
    uStack_51 = 0;
    uStack_4d = 0;
    uStack_4c = 0;
    abStack_68[0] = 0;
    abStack_68[1] = 0;
    abStack_68[2] = 0;
    abStack_68[3] = 0;
    abStack_68[4] = 0;
    abStack_68[5] = 0;
    abStack_68[6] = 0;
    abStack_68[7] = 0;
    abStack_68[8] = 0;
    abStack_68[9] = 0;
    abStack_68[10] = 0;
    abStack_68[0xb] = 0;
    abStack_68[0xc] = 0;
    abStack_68[0xd] = 0;
    abStack_68[0xe] = 0;
    abStack_68[0xf] = 0;
    lVar5 = 0;
    do {
      sVar3 = *(short *)((long)local_78.elems + lVar5);
      if (sVar3 != 0) break;
      bVar16 = lVar5 != 6;
      lVar5 = lVar5 + 2;
    } while (bVar16);
    if (sVar3 == 0) {
      uStack_4c = 0x30;
      uVar8 = 0x1c;
LAB_0016ad2a:
      if (show_base && 0 < (long)uVar8) {
        uVar8 = uVar8 - 1;
        abStack_68[uVar8 & 0xffffffff] = 0x30;
      }
      if (show_pos && 0 < (long)uVar8) {
        uVar8 = uVar8 - 1;
        abStack_68[uVar8 & 0xffffffff] = 0x2b;
      }
      if (field_width != 0) {
        lVar5 = 0;
        if (field_width < 0x1e) {
          lVar5 = 0x1d - field_width;
        }
        while (lVar5 < (long)uVar8) {
          uVar8 = uVar8 - 1;
          abStack_68[uVar8 & 0xffffffff] = fill_char_str;
        }
      }
      local_4b = 0;
      lVar5 = 0;
      do {
        bVar10 = abStack_68[lVar5 + uVar8];
        str_result[lVar5] = bVar10;
        lVar5 = lVar5 + 1;
      } while (bVar10 != 0);
      return true;
    }
    uVar8 = 0x1d;
    do {
      lVar5 = 0;
      do {
        sVar3 = *(short *)((long)local_78.elems + lVar5);
        if (sVar3 != 0) break;
        bVar16 = lVar5 != 6;
        lVar5 = lVar5 + 2;
      } while (bVar16);
      uVar9 = uVar8 - 1;
      if ((uVar8 == 0) || (sVar3 == 0)) goto LAB_0016ad2a;
      local_78.elems[0]._0_1_ = (byte)avVar15[0];
      abStack_68[uVar9 & 0xffffffff] = (byte)local_78.elems[0] & 7 | 0x30;
      lVar5 = 6;
      uVar11 = 0;
      do {
        uVar4 = *(ushort *)((long)local_78.elems + lVar5);
        *(ushort *)((long)local_78.elems + lVar5) = uVar11 | uVar4 >> 3;
        uVar11 = uVar4 << 0xd;
        lVar5 = lVar5 + -2;
        uVar8 = uVar9;
      } while (lVar5 != -2);
    } while( true );
  }
  avVar15 = *(value_type_conflict3 (*) [4])this;
  local_70[0] = avVar15[0];
  local_70[1] = avVar15[1];
  local_70[2] = avVar15[2];
  local_70[3] = avVar15[3];
  if ((long)avVar15 < 0) {
    avVar2 = (value_type_conflict3  [4])~(ulong)avVar15;
    local_70[0] = avVar2[0];
    local_70[1] = avVar2[1];
    local_70[2] = avVar2[2];
    local_70[3] = avVar2[3];
    lVar5 = 0;
    do {
      psVar1 = (short *)((long)local_70 + lVar5);
      *psVar1 = *psVar1 + 1;
      if (*psVar1 != 0) break;
      bVar16 = lVar5 != 6;
      lVar5 = lVar5 + 2;
    } while (bVar16);
  }
  abStack_68[0x10] = 0;
  abStack_68[0x11] = 0;
  abStack_68[0x12] = 0;
  abStack_68[0x13] = 0;
  abStack_68[0x14] = 0;
  abStack_68[0x15] = 0;
  abStack_68[0x16] = 0;
  uStack_51 = 0;
  uStack_4d = 0;
  abStack_68[0] = 0;
  abStack_68[1] = 0;
  abStack_68[2] = 0;
  abStack_68[3] = 0;
  abStack_68[4] = 0;
  abStack_68[5] = 0;
  abStack_68[6] = 0;
  abStack_68[7] = 0;
  abStack_68[8] = 0;
  abStack_68[9] = 0;
  abStack_68[10] = 0;
  abStack_68[0xb] = 0;
  abStack_68[0xc] = 0;
  abStack_68[0xd] = 0;
  abStack_68[0xe] = 0;
  abStack_68[0xf] = 0;
  lVar5 = 0;
  do {
    psVar1 = (short *)((long)local_70 + lVar5);
    if (*psVar1 != 0) break;
    bVar16 = lVar5 != 6;
    lVar5 = lVar5 + 2;
  } while (bVar16);
  if (*psVar1 != 0) {
    local_38[0] = avVar15[0];
    local_38[1] = avVar15[1];
    local_38[2] = avVar15[2];
    local_38[3] = avVar15[3];
    uVar8 = 0x1c;
    do {
      lVar5 = 0;
      do {
        psVar1 = (short *)((long)local_70 + lVar5);
        if (*psVar1 != 0) break;
        bVar16 = lVar5 != 6;
        lVar5 = lVar5 + 2;
      } while (bVar16);
      if ((uVar8 == 0) || (*psVar1 == 0)) goto LAB_0016abfb;
      uVar14 = 0;
      lVar5 = 6;
      uVar13 = 0;
      do {
        uVar13 = (uVar14 * 0xfff6 + uVar13) * 0x10000 | (uint)*(ushort *)((long)local_70 + lVar5);
        uVar14 = uVar13 / 10;
        *(short *)((long)local_70 + lVar5) = (short)uVar14;
        lVar5 = lVar5 + -2;
      } while (lVar5 != -2);
      local_40[0] = local_70[0];
      local_40[1] = local_70[1];
      local_40[2] = local_70[2];
      local_40[3] = local_70[3];
      lVar5 = 0;
      uVar14 = 0;
      do {
        uVar14 = uVar14 + ((uint)local_40[lVar5] + (uint)local_40[lVar5] * 4) * 2;
        local_40[lVar5] = (value_type_conflict3)uVar14;
        uVar14 = uVar14 >> 0x10;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_78.elems[0] = local_70[0];
      local_78.elems[1] = local_70[1];
      local_78.elems[2] = local_70[2];
      local_78.elems[3] = local_70[3];
      lVar5 = 0;
      bVar16 = false;
      do {
        uVar14 = ((uint)local_78.elems[lVar5] - (uint)bVar16) - (uint)local_40[lVar5];
        bVar16 = 0xffff < uVar14;
        local_78.elems[lVar5] = (value_type_conflict3)uVar14;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((long)local_78.elems < 0) {
        uVar6 = uintwide_t<64U,_unsigned_short,_void,_true>::operator-
                          ((uintwide_t<64U,_unsigned_short,_void,_true> *)&local_78);
        local_78.elems[0]._0_1_ = -(char)uVar6.values.super_array<unsigned_short,_4UL>.elems[0];
        local_78.elems._1_7_ = 0;
      }
      abStack_68[uVar8 - 1 & 0xffffffff] = (char)local_78.elems[0] + 0x30;
      uVar8 = uVar8 - 1;
    } while( true );
  }
  uStack_4d = 0x30;
  uVar8 = 0x1b;
LAB_0016ac21:
  if ((long)avVar15 < 0 || show_pos) {
    bVar10 = 0x2d;
    if (-1 < (long)avVar15) {
      bVar10 = !show_pos * '\x02' + 0x2b;
    }
    uVar8 = uVar8 - 1;
    abStack_68[uVar8 & 0xffffffff] = bVar10;
  }
LAB_0016ac52:
  if (field_width != 0) {
    lVar5 = 0;
    if (field_width < 0x1d) {
      lVar5 = 0x1c - field_width;
    }
    while (lVar5 < (long)uVar8) {
      uVar8 = uVar8 - 1;
      abStack_68[uVar8 & 0xffffffff] = fill_char_str;
    }
  }
  uStack_4c = 0;
  lVar5 = 0;
  do {
    bVar10 = abStack_68[lVar5 + uVar8];
    str_result[lVar5] = bVar10;
    lVar5 = lVar5 + 1;
  } while (bVar10 != 0);
  return true;
LAB_0016abfb:
  avVar15 = local_38;
  if ((long)uVar8 < 1) goto LAB_0016ac52;
  goto LAB_0016ac21;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }